

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

void __thiscall PlayerStrategy::PlayerStrategy(PlayerStrategy *this)

{
  int *piVar1;
  string *this_00;
  allocator<char> local_11;
  PlayerStrategy *local_10;
  PlayerStrategy *this_local;
  
  this->_vptr_PlayerStrategy = (_func_int **)&PTR___cxa_pure_virtual_00169808;
  local_10 = this;
  piVar1 = (int *)operator_new(4);
  *piVar1 = -1;
  this->numWeakest = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->armiesToPlace = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->exchangingCardType = piVar1;
  this->player = (Player *)0x0;
  this->from = (Country *)0x0;
  this->to = (Country *)0x0;
  this_00 = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"ABSTRACT",&local_11);
  this->strategyName = this_00;
  std::allocator<char>::~allocator(&local_11);
  return;
}

Assistant:

PlayerStrategy::PlayerStrategy() {
    this->armiesToPlace = new int(0);
    this->exchangingCardType = new int(0);
    this->player = nullptr;
    this->from = nullptr;
    this->to = nullptr;
    this->strategyName = new std::string("ABSTRACT");
}